

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall mocker::ir::Load::~Load(Load *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Load_00125428;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Load_00125448;
  p_Var1 = (this->addr).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Definition_00124fe0;
  p_Var1 = (this->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Load(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> addr)
      : IRInst(InstType::Load), Definition(std::move(dest)),
        addr(std::move(addr)) {}